

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

bool tinyusdz::hasTripleQuotes(string *str,bool is_double_quote)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  bool is_double_quote_local;
  string *str_local;
  
  local_28 = 0;
  do {
    uVar1 = ::std::__cxx11::string::size();
    if (uVar1 <= local_28) {
      return false;
    }
    uVar1 = ::std::__cxx11::string::size();
    if (local_28 + 3 < uVar1) {
      if (is_double_quote) {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        if (((*pcVar2 == '\"') &&
            (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\"')) &&
           (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\"')) {
          return true;
        }
      }
      else {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        if (((*pcVar2 == '\'') &&
            (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\'')) &&
           (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar2 == '\'')) {
          return true;
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool hasTripleQuotes(const std::string &str, bool is_double_quote) {
  for (size_t i = 0; i < str.size(); i++) {
    if (i + 3 < str.size()) {
      if (is_double_quote) {
        if ((str[i + 0] == '"') && (str[i + 1] == '"') && (str[i + 2] == '"')) {
          return true;
        }
      } else {
        if ((str[i + 0] == '\'') && (str[i + 1] == '\'') &&
            (str[i + 2] == '\'')) {
          return true;
        }
      }
    }
  }

  return false;
}